

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper.c
# Opt level: O0

target_ulong
helper_cc_compute_all_x86_64(target_ulong dst,target_ulong src1,target_ulong src2,int op)

{
  uint8_t dst_00;
  int iVar1;
  uint32_t src1_02;
  uint32_t dst_02;
  int op_local;
  target_ulong src2_local;
  target_ulong src1_local;
  target_ulong dst_local;
  uint8_t src1_00;
  uint16_t dst_01;
  uint16_t src1_01;
  
  dst_00 = (uint8_t)dst;
  dst_01 = (uint16_t)dst;
  dst_02 = (uint32_t)dst;
  src1_00 = (uint8_t)src1;
  src1_01 = (uint16_t)src1;
  src1_02 = (uint32_t)src1;
  switch(op) {
  case 1:
    dst_local = src1;
    break;
  case 2:
    iVar1 = compute_all_mulb(dst_00,src1);
    dst_local = (target_ulong)iVar1;
    break;
  case 3:
    iVar1 = compute_all_mulw(dst_01,src1);
    dst_local = (target_ulong)iVar1;
    break;
  case 4:
    iVar1 = compute_all_mull(dst_02,src1);
    dst_local = (target_ulong)iVar1;
    break;
  case 5:
    iVar1 = compute_all_mulq(dst,src1);
    dst_local = (target_ulong)iVar1;
    break;
  case 6:
    iVar1 = compute_all_addb(dst_00,src1_00);
    dst_local = (target_ulong)iVar1;
    break;
  case 7:
    iVar1 = compute_all_addw(dst_01,src1_01);
    dst_local = (target_ulong)iVar1;
    break;
  case 8:
    iVar1 = compute_all_addl(dst_02,src1_02);
    dst_local = (target_ulong)iVar1;
    break;
  case 9:
    iVar1 = compute_all_addq(dst,src1);
    dst_local = (target_ulong)iVar1;
    break;
  case 10:
    iVar1 = compute_all_adcb(dst_00,src1_00,(uint8_t)src2);
    dst_local = (target_ulong)iVar1;
    break;
  case 0xb:
    iVar1 = compute_all_adcw(dst_01,src1_01,(uint16_t)src2);
    dst_local = (target_ulong)iVar1;
    break;
  case 0xc:
    iVar1 = compute_all_adcl(dst_02,src1_02,(uint32_t)src2);
    dst_local = (target_ulong)iVar1;
    break;
  case 0xd:
    iVar1 = compute_all_adcq(dst,src1,src2);
    dst_local = (target_ulong)iVar1;
    break;
  case 0xe:
    iVar1 = compute_all_subb(dst_00,src1_00);
    dst_local = (target_ulong)iVar1;
    break;
  case 0xf:
    iVar1 = compute_all_subw(dst_01,src1_01);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x10:
    iVar1 = compute_all_subl(dst_02,src1_02);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x11:
    iVar1 = compute_all_subq(dst,src1);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x12:
    iVar1 = compute_all_sbbb(dst_00,src1_00,(uint8_t)src2);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x13:
    iVar1 = compute_all_sbbw(dst_01,src1_01,(uint16_t)src2);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x14:
    iVar1 = compute_all_sbbl(dst_02,src1_02,(uint32_t)src2);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x15:
    iVar1 = compute_all_sbbq(dst,src1,src2);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x16:
    iVar1 = compute_all_logicb(dst_00,src1_00);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x17:
    iVar1 = compute_all_logicw(dst_01,src1_01);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x18:
    iVar1 = compute_all_logicl(dst_02,src1_02);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x19:
    iVar1 = compute_all_logicq(dst,src1);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x1a:
    iVar1 = compute_all_incb(dst_00,src1_00);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x1b:
    iVar1 = compute_all_incw(dst_01,src1_01);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x1c:
    iVar1 = compute_all_incl(dst_02,src1_02);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x1d:
    iVar1 = compute_all_incq(dst,src1);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x1e:
    iVar1 = compute_all_decb(dst_00,src1_00);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x1f:
    iVar1 = compute_all_decw(dst_01,src1_01);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x20:
    iVar1 = compute_all_decl(dst_02,src1_02);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x21:
    iVar1 = compute_all_decq(dst,src1);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x22:
    iVar1 = compute_all_shlb(dst_00,src1_00);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x23:
    iVar1 = compute_all_shlw(dst_01,src1_01);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x24:
    iVar1 = compute_all_shll(dst_02,src1_02);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x25:
    iVar1 = compute_all_shlq(dst,src1);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x26:
    iVar1 = compute_all_sarb(dst_00,src1_00);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x27:
    iVar1 = compute_all_sarw(dst_01,src1_01);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x28:
    iVar1 = compute_all_sarl(dst_02,src1_02);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x29:
    iVar1 = compute_all_sarq(dst,src1);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x2a:
    iVar1 = compute_all_bmilgb(dst_00,src1_00);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x2b:
    iVar1 = compute_all_bmilgw(dst_01,src1_01);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x2c:
    iVar1 = compute_all_bmilgl(dst_02,src1_02);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x2d:
    iVar1 = compute_all_bmilgq(dst,src1);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x2e:
    dst_local = compute_all_adcx(dst,src1,src2);
    break;
  case 0x2f:
    dst_local = compute_all_adox(dst,src1,src2);
    break;
  case 0x30:
    dst_local = compute_all_adcox(dst,src1,src2);
    break;
  case 0x31:
    dst_local = 0x44;
    break;
  case 0x32:
    iVar1 = 0x40;
    if (src1 != 0) {
      iVar1 = 0;
    }
    dst_local = (target_ulong)iVar1;
    break;
  default:
    dst_local = 0;
  }
  return dst_local;
}

Assistant:

target_ulong helper_cc_compute_all(target_ulong dst, target_ulong src1,
                                   target_ulong src2, int op)
{
    switch (op) {
    default: /* should never happen */
        return 0;

    case CC_OP_EFLAGS:
        return src1;
    case CC_OP_CLR:
        return CC_Z | CC_P;
    case CC_OP_POPCNT:
        return src1 ? 0 : CC_Z;

    case CC_OP_MULB:
        return compute_all_mulb(dst, src1);
    case CC_OP_MULW:
        return compute_all_mulw(dst, src1);
    case CC_OP_MULL:
        return compute_all_mull(dst, src1);

    case CC_OP_ADDB:
        return compute_all_addb(dst, src1);
    case CC_OP_ADDW:
        return compute_all_addw(dst, src1);
    case CC_OP_ADDL:
        return compute_all_addl(dst, src1);

    case CC_OP_ADCB:
        return compute_all_adcb(dst, src1, src2);
    case CC_OP_ADCW:
        return compute_all_adcw(dst, src1, src2);
    case CC_OP_ADCL:
        return compute_all_adcl(dst, src1, src2);

    case CC_OP_SUBB:
        return compute_all_subb(dst, src1);
    case CC_OP_SUBW:
        return compute_all_subw(dst, src1);
    case CC_OP_SUBL:
        return compute_all_subl(dst, src1);

    case CC_OP_SBBB:
        return compute_all_sbbb(dst, src1, src2);
    case CC_OP_SBBW:
        return compute_all_sbbw(dst, src1, src2);
    case CC_OP_SBBL:
        return compute_all_sbbl(dst, src1, src2);

    case CC_OP_LOGICB:
        return compute_all_logicb(dst, src1);
    case CC_OP_LOGICW:
        return compute_all_logicw(dst, src1);
    case CC_OP_LOGICL:
        return compute_all_logicl(dst, src1);

    case CC_OP_INCB:
        return compute_all_incb(dst, src1);
    case CC_OP_INCW:
        return compute_all_incw(dst, src1);
    case CC_OP_INCL:
        return compute_all_incl(dst, src1);

    case CC_OP_DECB:
        return compute_all_decb(dst, src1);
    case CC_OP_DECW:
        return compute_all_decw(dst, src1);
    case CC_OP_DECL:
        return compute_all_decl(dst, src1);

    case CC_OP_SHLB:
        return compute_all_shlb(dst, src1);
    case CC_OP_SHLW:
        return compute_all_shlw(dst, src1);
    case CC_OP_SHLL:
        return compute_all_shll(dst, src1);

    case CC_OP_SARB:
        return compute_all_sarb(dst, src1);
    case CC_OP_SARW:
        return compute_all_sarw(dst, src1);
    case CC_OP_SARL:
        return compute_all_sarl(dst, src1);

    case CC_OP_BMILGB:
        return compute_all_bmilgb(dst, src1);
    case CC_OP_BMILGW:
        return compute_all_bmilgw(dst, src1);
    case CC_OP_BMILGL:
        return compute_all_bmilgl(dst, src1);

    case CC_OP_ADCX:
        return compute_all_adcx(dst, src1, src2);
    case CC_OP_ADOX:
        return compute_all_adox(dst, src1, src2);
    case CC_OP_ADCOX:
        return compute_all_adcox(dst, src1, src2);

#ifdef TARGET_X86_64
    case CC_OP_MULQ:
        return compute_all_mulq(dst, src1);
    case CC_OP_ADDQ:
        return compute_all_addq(dst, src1);
    case CC_OP_ADCQ:
        return compute_all_adcq(dst, src1, src2);
    case CC_OP_SUBQ:
        return compute_all_subq(dst, src1);
    case CC_OP_SBBQ:
        return compute_all_sbbq(dst, src1, src2);
    case CC_OP_LOGICQ:
        return compute_all_logicq(dst, src1);
    case CC_OP_INCQ:
        return compute_all_incq(dst, src1);
    case CC_OP_DECQ:
        return compute_all_decq(dst, src1);
    case CC_OP_SHLQ:
        return compute_all_shlq(dst, src1);
    case CC_OP_SARQ:
        return compute_all_sarq(dst, src1);
    case CC_OP_BMILGQ:
        return compute_all_bmilgq(dst, src1);
#endif
    }
}